

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enctest.cpp
# Opt level: O3

bool __thiscall
MotionTrajectory::AddConstantAccel(MotionTrajectory *this,double acc,double vEnd,bool isInfinite)

{
  pointer *pppMVar1;
  pointer ppMVar2;
  iterator __position;
  ConstantAccel *this_00;
  MotionBase *prevMotion;
  double dVar3;
  double dVar4;
  MotionBase *motion;
  ConstantAccel *local_28;
  
  ppMVar2 = (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppMVar2 ==
      (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    prevMotion = (MotionBase *)0x0;
  }
  else {
    prevMotion = ppMVar2[-1];
  }
  this_00 = (ConstantAccel *)operator_new(0x50);
  ConstantAccel::ConstantAccel(this_00,acc,vEnd,isInfinite,prevMotion);
  dVar3 = (this_00->super_MotionBase).t0;
  dVar4 = (this_00->super_MotionBase).tf;
  if ((dVar4 != dVar3) || (NAN(dVar4) || NAN(dVar3))) {
    __position._M_current =
         (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_28 = this_00;
      std::vector<MotionBase*,std::allocator<MotionBase*>>::_M_realloc_insert<MotionBase*const&>
                ((vector<MotionBase*,std::allocator<MotionBase*>> *)this,__position,
                 (MotionBase **)&local_28);
      dVar3 = (local_28->super_MotionBase).t0;
      dVar4 = (local_28->super_MotionBase).tf;
    }
    else {
      *__position._M_current = (MotionBase *)this_00;
      pppMVar1 = &(this->motionList).super__Vector_base<MotionBase_*,_std::allocator<MotionBase_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppMVar1 = *pppMVar1 + 1;
    }
  }
  return (bool)(-(dVar3 != dVar4) & 1);
}

Assistant:

bool MotionTrajectory::AddConstantAccel(double acc, double vEnd, bool isInfinite)
{
    const MotionBase *prevMotion = GetLastMotion();
    MotionBase *motion = new ConstantAccel(acc, vEnd, isInfinite, prevMotion);
    if (motion->IsOK())
        motionList.push_back(motion);
    return motion->IsOK();
}